

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

shared_ptr<ASTNode> __thiscall SchemeInt::to_AST(SchemeInt *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  shared_ptr<ASTNode> sVar1;
  string local_40 [36];
  _Alloc_hider local_1c;
  undefined3 uStack_1b;
  SchemeInt *this_local;
  
  local_1c = (_Alloc_hider)0x2;
  uStack_1b = 0;
  this_local = this;
  (**(code **)(*in_RSI + 0x10))();
  std::make_shared<ASTNode,ast_type_t,std::__cxx11::string>
            ((ast_type_t *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe4);
  std::__cxx11::string::~string(local_40);
  sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ASTNode>)sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ASTNode> SchemeInt::to_AST() const
{
    return std::make_shared<ASTNode>(ast_type_t::INT, external_repr());
}